

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

Hop_Obj_t * Hop_Transfer(Hop_Man_t *pSour,Hop_Man_t *pDest,Hop_Obj_t *pRoot,int nVars)

{
  int iVar1;
  undefined8 *puVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pObj;
  
  if (pSour != pDest) {
    pObj = (Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe);
    iVar1 = Hop_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      for (iVar1 = 0; iVar1 < pSour->vPis->nSize; iVar1 = iVar1 + 1) {
        puVar2 = (undefined8 *)Vec_PtrEntry(pSour->vPis,iVar1);
        if (nVars == iVar1) break;
        pHVar3 = Hop_IthVar(pDest,iVar1);
        *puVar2 = pHVar3;
      }
      Hop_Transfer_rec(pDest,pObj);
      Hop_ConeUnmark_rec(pObj);
    }
    else {
      pObj = (Hop_Obj_t *)&pDest->pConst1;
    }
    pRoot = (Hop_Obj_t *)((ulong)((uint)pRoot & 1) ^ (ulong)(pObj->field_0).pData);
  }
  return pRoot;
}

Assistant:

Hop_Obj_t * Hop_Transfer( Hop_Man_t * pSour, Hop_Man_t * pDest, Hop_Obj_t * pRoot, int nVars )
{
    Hop_Obj_t * pObj;
    int i;
    // solve simple cases
    if ( pSour == pDest )
        return pRoot;
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return Hop_NotCond( Hop_ManConst1(pDest), Hop_IsComplement(pRoot) );
    // set the PI mapping
    Hop_ManForEachPi( pSour, pObj, i )
    {
        if ( i == nVars )
           break;
        pObj->pData = Hop_IthVar(pDest, i);
    }
    // transfer and set markings
    Hop_Transfer_rec( pDest, Hop_Regular(pRoot) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}